

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_C14NDocSaveTo(PyObject *self,PyObject *args)

{
  xmlChar *pxVar1;
  xmlChar **ppxVar2;
  int iVar3;
  int iVar4;
  FILE *f;
  undefined8 uVar5;
  PyObject *pPVar6;
  char *pcVar7;
  long lVar8;
  xmlChar **ppxVar9;
  int exclusive;
  int with_comments;
  xmlChar **prefixes;
  xmlNodeSetPtr nodes;
  PyObject *pyobj_prefixes;
  PyObject *pyobj_nodes;
  PyObject *py_file;
  PyObject *pyobj_doc;
  
  prefixes = (xmlChar **)0x0;
  iVar3 = _PyArg_ParseTuple_SizeT
                    (args,"OOiOiO:C14NDocSaveTo",&pyobj_doc,&pyobj_nodes,&exclusive,&pyobj_prefixes,
                     &with_comments,&py_file);
  if (iVar3 == 0) {
    return (PyObject *)0x0;
  }
  if (pyobj_doc == (PyObject *)&_Py_NoneStruct) {
    lVar8 = 0;
  }
  else {
    lVar8 = pyobj_doc[1].ob_refcnt;
  }
  if (lVar8 == 0) {
    pcVar7 = "bad document.";
    uVar5 = _PyExc_TypeError;
  }
  else {
    if (py_file == (PyObject *)&_Py_NoneStruct) {
      f = (FILE *)0x0;
    }
    else {
      f = libxml_PyFileGet(py_file);
    }
    if (f != (FILE *)0x0) {
      uVar5 = xmlOutputBufferCreateFile(f,0);
      iVar3 = PyxmlNodeSet_Convert(pyobj_nodes,&nodes);
      if (-1 < iVar3) {
        if ((exclusive == 0) || (iVar3 = PystringSet_Convert(pyobj_prefixes,&prefixes), -1 < iVar3))
        {
          ppxVar2 = prefixes;
          iVar3 = xmlC14NDocSaveTo(lVar8,nodes,exclusive,prefixes,with_comments,uVar5);
          if (nodes != (xmlNodeSetPtr)0x0) {
            (*_xmlFree)(nodes->nodeTab);
            (*_xmlFree)(nodes);
          }
          if (ppxVar2 != (xmlChar **)0x0) {
            pxVar1 = *ppxVar2;
            ppxVar9 = ppxVar2;
            while (pxVar1 != (xmlChar *)0x0) {
              ppxVar9 = ppxVar9 + 1;
              (*_xmlFree)();
              pxVar1 = *ppxVar9;
            }
            (*_xmlFree)(ppxVar2);
          }
          libxml_PyFileRelease(f);
          iVar4 = xmlOutputBufferClose(uVar5);
          if (-1 < iVar3) {
            pPVar6 = (PyObject *)PyLong_FromLong((long)iVar4);
            return pPVar6;
          }
          pcVar7 = "libxml2 xmlC14NDocSaveTo failure.";
          uVar5 = _PyExc_Exception;
          goto LAB_0013e967;
        }
        if (nodes != (xmlNodeSetPtr)0x0) {
          (*_xmlFree)(nodes->nodeTab);
          (*_xmlFree)(nodes);
        }
      }
      xmlOutputBufferClose(uVar5);
      return (PyObject *)0x0;
    }
    pcVar7 = "bad file.";
    uVar5 = _PyExc_TypeError;
  }
LAB_0013e967:
  PyErr_SetString(uVar5,pcVar7);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *
libxml_C14NDocSaveTo(ATTRIBUTE_UNUSED PyObject * self,
                     PyObject * args)
{
    PyObject *pyobj_doc;
    PyObject *py_file;
    PyObject *pyobj_nodes;
    int exclusive;
    PyObject *pyobj_prefixes;
    int with_comments;

    xmlDocPtr doc;
    xmlNodeSetPtr nodes;
    xmlChar **prefixes = NULL;
    FILE * output;
    xmlOutputBufferPtr buf;

    int result;
    int len;

    if (!PyArg_ParseTuple(args, (char *) "OOiOiO:C14NDocSaveTo",
                          &pyobj_doc,
                          &pyobj_nodes,
                          &exclusive,
                          &pyobj_prefixes,
                          &with_comments,
                          &py_file))
        return (NULL);

    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    if (!doc) {
        PyErr_SetString(PyExc_TypeError, "bad document.");
        return NULL;
    }

    output = PyFile_Get(py_file);
    if (output == NULL) {
        PyErr_SetString(PyExc_TypeError, "bad file.");
        return NULL;
    }
    buf = xmlOutputBufferCreateFile(output, NULL);

    result = PyxmlNodeSet_Convert(pyobj_nodes, &nodes);
    if (result < 0) {
        xmlOutputBufferClose(buf);
        return NULL;
    }

    if (exclusive) {
        result = PystringSet_Convert(pyobj_prefixes, &prefixes);
        if (result < 0) {
            if (nodes) {
                xmlFree(nodes->nodeTab);
                xmlFree(nodes);
            }
            xmlOutputBufferClose(buf);
            return NULL;
        }
    }

    result = xmlC14NDocSaveTo(doc,
                              nodes,
                              exclusive,
                              prefixes,
                              with_comments,
                              buf);

    if (nodes) {
        xmlFree(nodes->nodeTab);
        xmlFree(nodes);
    }
    if (prefixes) {
        xmlChar ** idx = prefixes;
        while (*idx) xmlFree(*(idx++));
        xmlFree(prefixes);
    }

    PyFile_Release(output);
    len = xmlOutputBufferClose(buf);

    if (result < 0) {
        PyErr_SetString(PyExc_Exception,
                        "libxml2 xmlC14NDocSaveTo failure.");
        return NULL;
    }
    else
        return PyLong_FromLong((long) len);
}